

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglcompositor.cpp
# Opt level: O0

QRect * __thiscall QOpenGLCompositor::grab(QOpenGLCompositor *this)

{
  QSize fbo_00;
  QOpenGLFramebufferObject *in_RSI;
  QRect *in_RDI;
  long in_FS_OFFSET;
  QOpenGLFramebufferObject *unaff_retaddr;
  QOpenGLFramebufferObject fbo;
  QRect *pQVar1;
  QOpenGLCompositor *this_00;
  GLenum target;
  QSize *size;
  GrabOrientation orientation;
  
  size = *(QSize **)(in_FS_OFFSET + 0x28);
  this_00 = (QOpenGLCompositor *)0xaaaaaaaaaaaaaaaa;
  target = 0xaaaaaaaa;
  pQVar1 = in_RDI;
  fbo_00 = QRect::size(in_RDI);
  orientation = (GrabOrientation)((ulong)pQVar1 >> 0x20);
  QOpenGLFramebufferObject::QOpenGLFramebufferObject(unaff_retaddr,size,target);
  grabToFrameBufferObject(this_00,(QOpenGLFramebufferObject *)fbo_00,orientation);
  QOpenGLFramebufferObject::toImage(in_RSI,SUB81((ulong)in_RDI >> 0x38,0));
  QOpenGLFramebufferObject::~QOpenGLFramebufferObject((QOpenGLFramebufferObject *)fbo_00);
  if (*(QSize **)(in_FS_OFFSET + 0x28) == size) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QImage QOpenGLCompositor::grab()
{
    Q_ASSERT(m_context && m_targetWindow);
    QOpenGLFramebufferObject fbo(m_nativeTargetGeometry.size());
    grabToFrameBufferObject(&fbo);
    return fbo.toImage();
}